

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# results_cache.hpp
# Opt level: O3

match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::detail::
results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::append_new(results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,nested_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *out)

{
  node_base *pnVar1;
  node_base *pnVar2;
  node_base *pnVar3;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  
  if ((this->cache_).
      super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._sentry._next == (node_base *)this) {
    local_d8.nested_results_.
    super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._sentry._prev = (node_base *)&local_d8.nested_results_;
    local_d8.prefix_.super_type.m_initialized = false;
    local_d8.suffix_.super_type.m_initialized = false;
    local_d8.regex_id_ = (regex_id_type)0x0;
    local_d8.sub_matches_.size_._0_1_ = 0;
    local_d8.sub_matches_.size_._1_7_ = 0;
    local_d8.sub_matches_.sub_matches_._0_1_ = 0;
    local_d8._17_8_ = 0;
    local_d8.args_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_d8.args_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_d8.extras_ptr_.px =
         (results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    local_d8.traits_.px = (traits<char> *)0x0;
    local_d8.args_._M_t._M_impl._0_8_ = 0;
    local_d8.args_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d8.args_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_d8.args_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d8.args_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_d8.named_marks_.
    super__Vector_base<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.named_marks_.
    super__Vector_base<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.named_marks_.
    super__Vector_base<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.nested_results_.
    super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._sentry._next =
         local_d8.nested_results_.
         super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._sentry._prev;
    local_d8.args_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_d8.args_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&out->
                 super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ,&local_d8);
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~match_results(&local_d8);
    pnVar3 = (out->
             super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._sentry._prev;
  }
  else {
    pnVar3 = (this->cache_).
             super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._sentry._prev;
    pnVar1 = pnVar3->_prev;
    pnVar2 = pnVar3->_next;
    pnVar1->_next = pnVar2;
    pnVar2->_prev = pnVar1;
    pnVar3->_next = (node_base *)out;
    pnVar1 = (out->
             super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._sentry._prev;
    pnVar3->_prev = pnVar1;
    pnVar1->_next = pnVar3;
    (out->
    super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._sentry._prev = pnVar3;
  }
  return (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(pnVar3 + 1);
}

Assistant:

match_results<BidiIter> &append_new(nested_results<BidiIter> &out)
        {
            if(this->cache_.empty())
            {
                out.push_back(match_results<BidiIter>());
            }
            else
            {
                BOOST_ASSERT(access::get_nested_results(this->cache_.back()).empty());
                out.splice(out.end(), this->cache_, --this->cache_.end());
            }
            return out.back();
        }